

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameExistsAndWasSet::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined8 extraout_RAX;
  char *value;
  FlagSaver fs;
  FlagSaver FStack_58;
  string local_50;
  string local_30;
  
  FlagSaver::FlagSaver(&FStack_58);
  value = "NameExistsAndWasSet";
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineOptionTest");
  SetCommandLineOption_abi_cxx11_(&local_30,(gflags *)0x150845,"700",value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  paVar1 = &local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_7_ = 0x6562206c6c6977;
  local_50.field_2._M_local_buf[7] = ' ';
  local_50.field_2._8_7_ = 0x6465676e616863;
  local_50._M_string_length = 0xf;
  local_50.field_2._M_local_buf[0xf] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = GetCommandLineOption("test_int32",&local_50);
  if (bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar3 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      FlagSaver::~FlagSaver(&FStack_58);
      return;
    }
  }
  else {
    _GLOBAL__N_1::Test_GetCommandLineOptionTest_NameExistsAndWasSet::Run();
  }
  _GLOBAL__N_1::Test_GetCommandLineOptionTest_NameExistsAndWasSet::Run();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&FStack_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(GetCommandLineOptionTest, NameExistsAndWasSet) {
  SetCommandLineOption("test_int32", "700");
  string value("will be changed");
  const bool r = GetCommandLineOption("test_int32", &value);
  EXPECT_TRUE(r);
  EXPECT_EQ("700", value);
}